

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O2

void __thiscall rtosc::UndoHistoryImpl::clear(UndoHistoryImpl *this)

{
  _Elt_pointer ppVar1;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *__range1;
  _Elt_pointer ppVar2;
  _Elt_pointer ppVar3;
  _Map_pointer pppVar4;
  
  ppVar3 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar2 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar4 = (this->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar1 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (ppVar3 != ppVar1) {
    if (ppVar3->second != (char *)0x0) {
      operator_delete__(ppVar3->second);
    }
    ppVar3 = ppVar3 + 1;
    if (ppVar3 == ppVar2) {
      ppVar3 = pppVar4[1];
      pppVar4 = pppVar4 + 1;
      ppVar2 = ppVar3 + 0x20;
    }
  }
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::clear
            (&this->history);
  this->history_pos = 0;
  return;
}

Assistant:

void UndoHistoryImpl::clear(void)
{
    for(auto elm : history)
        delete [] elm.second;
    history.clear();
    history_pos = 0;
}